

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

bool __thiscall Rml::DataParser::Match(DataParser *this,char c,bool skip_whitespace)

{
  char cVar1;
  bool skip_whitespace_local;
  char c_local;
  DataParser *this_local;
  
  cVar1 = Look(this);
  if (c == cVar1) {
    Next(this);
    if (skip_whitespace) {
      SkipWhitespace(this);
    }
    this_local._7_1_ = true;
  }
  else {
    Expected(this,c);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Match(char c, bool skip_whitespace = true)
	{
		if (c == Look())
		{
			Next();
			if (skip_whitespace)
				SkipWhitespace();
			return true;
		}
		Expected(c);
		return false;
	}